

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O2

FT_Error cff_ps_get_font_extra(CFF_Face face,PS_FontExtraRec *afont_extra)

{
  byte bVar1;
  CFF_Font_conflict font;
  FT_UShort FVar2;
  FT_Error FVar3;
  PS_FontExtraRec *pPVar4;
  FT_String *__haystack;
  char *pcVar5;
  byte *pbVar6;
  FT_String *s;
  byte *__haystack_00;
  FT_Error local_2c [2];
  FT_Error error;
  
  font = (CFF_Font_conflict)(face->extra).data;
  local_2c[0] = 0;
  if (font == (CFF_Font_conflict)0x0) {
    FVar3 = 0;
  }
  else {
    pPVar4 = font->font_extra;
    FVar3 = 0;
    if (pPVar4 == (PS_FontExtraRec *)0x0) {
      pPVar4 = (PS_FontExtraRec *)ft_mem_alloc((face->root).memory,2,local_2c);
      if (local_2c[0] != 0) {
        return local_2c[0];
      }
      pPVar4->fs_type = 0;
      __haystack = cff_index_get_sid_string(font,(font->top_font).font_dict.embedded_postscript);
      if ((__haystack != (FT_String *)0x0) &&
         (pcVar5 = strstr(__haystack,"/FSType"), pcVar5 != (char *)0x0)) {
        __haystack_00 = (byte *)(pcVar5 + 7);
        pbVar6 = (byte *)strstr((char *)__haystack_00,"def");
        if (pbVar6 != (byte *)0x0) {
          for (; __haystack_00 != pbVar6; __haystack_00 = __haystack_00 + 1) {
            bVar1 = *__haystack_00;
            if ((byte)(bVar1 - 0x30) < 10) {
              if (0x1997 < pPVar4->fs_type) {
LAB_001fac59:
                pPVar4->fs_type = 0;
                break;
              }
              FVar2 = pPVar4->fs_type * 10;
              pPVar4->fs_type = FVar2;
              pPVar4->fs_type = (FVar2 + (short)(char)*__haystack_00) - 0x30;
            }
            else if ((0x20 < bVar1) || ((0x100002400U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
            goto LAB_001fac59;
          }
        }
      }
      font->font_extra = pPVar4;
      FVar3 = local_2c[0];
    }
    afont_extra->fs_type = pPVar4->fs_type;
  }
  return FVar3;
}

Assistant:

static FT_Error
  cff_ps_get_font_extra( CFF_Face          face,
                         PS_FontExtraRec*  afont_extra )
  {
    CFF_Font  cff   = (CFF_Font)face->extra.data;
    FT_Error  error = FT_Err_Ok;


    if ( cff && cff->font_extra == NULL )
    {
      CFF_FontRecDict   dict       = &cff->top_font.font_dict;
      PS_FontExtraRec*  font_extra = NULL;
      FT_Memory         memory     = face->root.memory;
      FT_String*        embedded_postscript;


      if ( FT_ALLOC( font_extra, sizeof ( *font_extra ) ) )
        goto Fail;

      font_extra->fs_type = 0U;

      embedded_postscript = cff_index_get_sid_string(
                              cff,
                              dict->embedded_postscript );
      if ( embedded_postscript )
      {
        FT_String*  start_fstype;
        FT_String*  start_def;


        /* Identify the XYZ integer in `/FSType XYZ def' substring. */
        if ( ( start_fstype = ft_strstr( embedded_postscript,
                                         "/FSType" ) ) != NULL    &&
             ( start_def = ft_strstr( start_fstype +
                                        sizeof ( "/FSType" ) - 1,
                                      "def" ) ) != NULL           )
        {
          FT_String*  s;


          for ( s = start_fstype + sizeof ( "/FSType" ) - 1;
                s != start_def;
                s++ )
          {
            if ( *s >= '0' && *s <= '9' )
            {
              if ( font_extra->fs_type >= ( FT_USHORT_MAX - 9 ) / 10 )
              {
                /* Overflow - ignore the FSType value.  */
                font_extra->fs_type = 0U;
                break;
              }

              font_extra->fs_type *= 10;
              font_extra->fs_type += (FT_UShort)( *s - '0' );
            }
            else if ( *s != ' ' && *s != '\n' && *s != '\r' )
            {
              /* Non-whitespace character between `/FSType' and next `def' */
              /* - ignore the FSType value.                                */
              font_extra->fs_type = 0U;
              break;
            }
          }
        }
      }

      cff->font_extra = font_extra;
    }

    if ( cff )
      *afont_extra = *cff->font_extra;

  Fail:
    return error;
  }